

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::elementAccessTest<true>(ViewTest *this)

{
  int *piVar1;
  undefined8 uVar2;
  ViewTest *pVVar3;
  uint uVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  reference piVar6;
  size_t sVar7;
  size_t sVar8;
  logic_error *plVar9;
  code *pcVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  unsigned_long uVar14;
  value_type *__val_2;
  undefined *puVar15;
  size_t sVar16;
  value_type *__val;
  int iVar17;
  value_type *__val_1;
  bool bVar18;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  int local_a4;
  int *local_a0;
  unsigned_long local_98;
  undefined1 local_90 [16];
  size_t *local_80;
  size_t *local_78;
  size_t *local_70;
  size_t local_68;
  size_t local_60;
  CoordinateOrder local_58;
  bool local_54;
  unsigned_long *local_50;
  unsigned_long *local_48;
  ViewTest *local_40;
  unsigned_long *local_38;
  
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 6;
  _Var5._M_current[1] = 4;
  local_a0 = this->data_;
  local_90._0_8_ = local_a0;
  local_40 = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  it._M_current = (unsigned_long *)operator_new(0x10);
  *it._M_current = 0;
  it._M_current[1] = 0;
  sVar16 = 0;
  do {
    uVar14 = 0;
    do {
      *it._M_current = sVar16;
      it._M_current[1] = uVar14;
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_90,sVar16,uVar14);
      iVar17 = *piVar6;
      piVar6 = andres::marray_detail::AccessOperatorHelper<false>::
               execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,true,std::allocator<unsigned_long>>
                         ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,it);
      if (iVar17 != *piVar6) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(it._M_current,0x10);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  local_50 = (unsigned_long *)operator_new(0x18);
  *local_50 = 0;
  local_50[1] = 0;
  *local_50 = 3;
  local_50[1] = 4;
  local_50[2] = 2;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_50,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_50 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  _Var5._M_current[2] = 0;
  local_98 = 0;
  do {
    sVar16 = 0;
    do {
      uVar14 = 0;
      do {
        *_Var5._M_current = local_98;
        _Var5._M_current[1] = sVar16;
        _Var5._M_current[2] = uVar14;
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
        uVar2 = local_90._0_8_;
        if (((int *)local_90._0_8_ == (int *)0x0) || (local_68 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar15 = &std::runtime_error::typeinfo;
LAB_00199d53:
          __cxa_throw(plVar9,puVar15,pcVar10);
        }
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,0);
        sVar8 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,3,sVar16,
                           uVar14);
        iVar17 = *(int *)(uVar2 + (sVar7 * local_98 + sVar8) * 4);
        piVar6 = andres::marray_detail::AccessOperatorHelper<false>::
                 execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,true,std::allocator<unsigned_long>>
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,_Var5);
        if (iVar17 != *piVar6) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar15 = &std::logic_error::typeinfo;
          goto LAB_00199d53;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 == 1);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_98 = local_98 + 1;
  } while (local_98 != 3);
  operator_delete(_Var5._M_current,0x18);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(local_50,0x18);
  local_90._0_8_ = local_40;
  local_80 = (size_t *)operator_new(0);
  local_68 = 0;
  local_60 = 1;
  local_58 = LastMajorOrder;
  local_54 = true;
  local_78 = local_80;
  local_70 = local_80;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  local_a4 = 0;
  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,&local_a4);
  if (*piVar6 != 0x2a) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar9,"test failed.");
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_80,local_68 * 0x18);
  local_90._0_8_ = local_40;
  local_80 = (size_t *)operator_new(0);
  local_68 = 0;
  local_60 = 1;
  local_58 = LastMajorOrder;
  local_54 = true;
  local_78 = local_80;
  local_70 = local_80;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  local_a4 = 0;
  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,&local_a4);
  if (*piVar6 != 0x2a) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar9,"test failed.");
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_80,local_68 * 0x18);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  sVar16 = 0;
  do {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,sVar16);
    if (*piVar6 != local_a0[sVar16]) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 0x18);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(_Var5._M_current,8);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  sVar16 = 0;
  do {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,sVar16);
    if (*piVar6 != local_a0[sVar16]) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    sVar16 = sVar16 + 1;
  } while (sVar16 != 0x18);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(_Var5._M_current,8);
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 4;
  _Var5._M_current[1] = 6;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  iVar17 = 0;
  lVar12 = 0;
  do {
    piVar1 = local_a0;
    iVar11 = (int)lVar12;
    lVar12 = (long)iVar11 + 4;
    sVar16 = 0;
    do {
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_90,sVar16,iVar17);
      if (*piVar6 != piVar1[(long)iVar11 + sVar16]) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 6);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 4;
  _Var5._M_current[1] = 6;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  iVar17 = 0;
  lVar12 = 0;
  do {
    piVar1 = local_a0;
    iVar11 = (int)lVar12;
    lVar12 = (long)iVar11 + 4;
    sVar16 = 0;
    do {
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_90,sVar16,iVar17);
      if (*piVar6 != piVar1[(long)iVar11 + sVar16]) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 6);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  local_38 = (unsigned_long *)operator_new(0x18);
  *local_38 = 0;
  local_38[1] = 0;
  *local_38 = 3;
  local_38[1] = 4;
  local_38[2] = 2;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_38,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_38 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  local_98 = 0;
  uVar4 = 0;
  do {
    local_50 = (unsigned_long *)(ulong)uVar4;
    local_48 = (unsigned_long *)CONCAT44(local_48._4_4_,uVar4 + 0xc);
    sVar16 = 0;
    do {
      piVar1 = local_a0;
      iVar17 = (int)local_50;
      local_50 = (unsigned_long *)(ulong)(iVar17 + 3);
      lVar12 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
        uVar2 = local_90._0_8_;
        if (((int *)local_90._0_8_ == (int *)0x0) || (local_68 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar15 = &std::runtime_error::typeinfo;
LAB_00199db1:
          __cxa_throw(plVar9,puVar15,pcVar10);
        }
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,0);
        sVar8 = andres::View<int,_true,_std::allocator<unsigned_long>_>::elementAccessHelper<int>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,3,sVar16,
                           (int)local_98);
        if (*(int *)(uVar2 + (sVar7 * lVar12 + sVar8) * 4) != piVar1[iVar17 + lVar12]) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar15 = &std::logic_error::typeinfo;
          goto LAB_00199db1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    iVar17 = (int)local_98;
    local_98 = (unsigned_long)(iVar17 + 1);
    uVar4 = (uint)local_48;
  } while (iVar17 == 0);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(local_38,0x18);
  local_38 = (unsigned_long *)operator_new(0x18);
  *local_38 = 0;
  local_38[1] = 0;
  *local_38 = 3;
  local_38[1] = 4;
  local_38[2] = 2;
  local_90._0_8_ = local_a0;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_38,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_38 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
  local_98 = 0;
  uVar4 = 0;
  do {
    local_50 = (unsigned_long *)(ulong)uVar4;
    local_48 = (unsigned_long *)CONCAT44(local_48._4_4_,uVar4 + 0xc);
    sVar16 = 0;
    do {
      piVar1 = local_a0;
      iVar17 = (int)local_50;
      local_50 = (unsigned_long *)(ulong)(iVar17 + 3);
      lVar12 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
        uVar2 = local_90._0_8_;
        if (((int *)local_90._0_8_ == (int *)0x0) || (local_68 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar15 = &std::runtime_error::typeinfo;
LAB_00199e0f:
          __cxa_throw(plVar9,puVar15,pcVar10);
        }
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,0);
        sVar8 = andres::View<int,_true,_std::allocator<unsigned_long>_>::elementAccessHelper<int>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90,3,sVar16,
                           (int)local_98);
        if (*(int *)(uVar2 + (sVar7 * lVar12 + sVar8) * 4) != piVar1[iVar17 + lVar12]) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar15 = &std::logic_error::typeinfo;
          goto LAB_00199e0f;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    iVar17 = (int)local_98;
    local_98 = (unsigned_long)(iVar17 + 1);
    uVar4 = (uint)local_48;
    if (iVar17 != 0) {
      operator_delete(local_80,local_68 * 0x18);
      operator_delete(local_38,0x18);
      local_48 = (unsigned_long *)operator_new(0x20);
      *local_48 = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      *local_48 = 3;
      local_48[1] = 4;
      local_48[2] = 2;
      local_48[3] = 2;
      local_90._0_8_ = local_40->data100_;
      local_40 = (ViewTest *)local_90._0_8_;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_48,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_48 + 4),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_a4);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
      uVar4 = 0;
      iVar17 = 0;
      do {
        local_a0 = (int *)(ulong)uVar4;
        local_50 = (unsigned_long *)CONCAT44(local_50._4_4_,uVar4 + 0x18);
        iVar11 = 0;
        do {
          iVar13 = 0;
          uVar14 = (unsigned_long)local_a0;
          local_a0 = (int *)(ulong)((int)local_a0 + 0xc);
          do {
            pVVar3 = local_40;
            local_98 = (unsigned_long)((int)uVar14 + 3);
            sVar16 = 0;
            do {
              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                                 ((View<int,true,std::allocator<unsigned_long>> *)local_90,sVar16,
                                  iVar13,iVar11,iVar17);
              if (*piVar6 != *(int *)((long)pVVar3 + ((long)(int)uVar14 + sVar16) * 4)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar16 = sVar16 + 1;
            } while (sVar16 != 3);
            iVar13 = iVar13 + 1;
            uVar14 = local_98;
          } while (iVar13 != 4);
          bVar18 = iVar11 == 0;
          iVar11 = iVar11 + 1;
        } while (bVar18);
        bVar18 = iVar17 == 0;
        uVar4 = (uint)local_50;
        iVar17 = iVar17 + 1;
      } while (bVar18);
      operator_delete(local_80,local_68 * 0x18);
      operator_delete(local_48,0x20);
      local_48 = (unsigned_long *)operator_new(0x20);
      *local_48 = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      *local_48 = 3;
      local_48[1] = 4;
      local_48[2] = 2;
      local_48[3] = 2;
      local_90._0_8_ = local_40;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_48,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_48 + 4),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_a4);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_90);
      iVar17 = 0;
      uVar4 = 0;
      do {
        local_a0 = (int *)(ulong)uVar4;
        local_50 = (unsigned_long *)CONCAT44(local_50._4_4_,uVar4 + 0x18);
        iVar11 = 0;
        do {
          iVar13 = 0;
          uVar14 = (unsigned_long)local_a0;
          local_a0 = (int *)(ulong)((int)local_a0 + 0xc);
          do {
            pVVar3 = local_40;
            local_98 = (unsigned_long)((int)uVar14 + 3);
            sVar16 = 0;
            do {
              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                                 ((View<int,true,std::allocator<unsigned_long>> *)local_90,sVar16,
                                  iVar13,iVar11,iVar17);
              if (*piVar6 != *(int *)((long)pVVar3 + ((long)(int)uVar14 + sVar16) * 4)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar16 = sVar16 + 1;
            } while (sVar16 != 3);
            iVar13 = iVar13 + 1;
            uVar14 = local_98;
          } while (iVar13 != 4);
          bVar18 = iVar11 == 0;
          iVar11 = iVar11 + 1;
        } while (bVar18);
        bVar18 = iVar17 == 0;
        iVar17 = iVar17 + 1;
        uVar4 = (uint)local_50;
      } while (bVar18);
      operator_delete(local_80,local_68 * 0x18);
      operator_delete(local_48,0x20);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::elementAccessTest(){
    // element access by coordinate
    {
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(2);
        
            for(std::size_t x=0; x<6; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    w[0] = x;
                    w[1] = y;
                    test(v(x, y) == v(w.begin()));
                }
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(3);
        
            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        w[0] = x;
                        w[1] = y;
                        w[2] = z; 
                        test(v(x, y, z) == v(w.begin()));
                    }
                }
            }
        }
    }
    // scalar
    {
        {
            andres::View<int, constTarget> v(&scalar_);
            
            test(v(0) == 42);
        }
        // const
        {
            andres::View<int, constTarget> const v(&scalar_);
            
            test(v(0) == 42);
        }
    }
    // 1D 
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
    }
    // 3D 
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
        // const
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
    // 4D 
    {
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
    }
}